

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMarkAsAdvancedCommand.cxx
# Opt level: O2

bool cmMarkAsAdvancedCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  PolicyStatus PVar4;
  cmState *this;
  cmValue cVar5;
  cmake *this_00;
  string *key;
  ulong uVar6;
  allocator<char> local_c9;
  cmMakefile *local_c8;
  char *local_c0;
  cmAlphaNum local_b8;
  cmExecutionStatus *local_88;
  cmAlphaNum local_80;
  string err;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (__lhs == (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"called with incorrect number of arguments",
               (allocator<char> *)&local_80);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00258688:
    std::__cxx11::string::~string((string *)&local_b8);
    bVar2 = false;
  }
  else {
    bVar2 = std::operator==(__lhs,"CLEAR");
    if ((bVar2) ||
       (bVar2 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start,"FORCE"), bVar2)) {
      bVar2 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start,"CLEAR");
      local_c0 = "1";
      if (bVar2) {
        local_c0 = "0";
      }
      bVar2 = true;
      uVar6 = 1;
    }
    else {
      local_c0 = "1";
      uVar6 = 0;
      bVar2 = false;
    }
    local_c8 = status->Makefile;
    local_88 = status;
    this = cmMakefile::GetState(local_c8);
    for (; pbVar1 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start,
        uVar6 < (ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
        uVar6 = (ulong)((int)uVar6 + 1)) {
      key = pbVar1 + uVar6;
      PVar4 = cmMakefile::GetPolicyStatus(local_c8,CMP0102,false);
      if (PVar4 - NEW < 3) {
        cVar5 = cmState::GetCacheEntryValue(this,key);
        if (cVar5.Value != (string *)0x0) goto LAB_002585b3;
      }
      else {
        if (PVar4 != OLD) {
          if (PVar4 != WARN) goto LAB_002585b3;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,"CMAKE_POLICY_WARNING_CMP0102",(allocator<char> *)&local_80
                    );
          bVar3 = cmMakefile::PolicyOptionalWarningEnabled(local_c8,(string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_b8);
          if ((bVar3) &&
             (cVar5 = cmState::GetCacheEntryValue(this,key), cVar5.Value == (string *)0x0)) {
            local_b8.View_._M_len = 0x2f;
            local_b8.View_._M_str = "Policy CMP0102 is not set: The variable named \"";
            local_80.View_._M_str = (key->_M_dataplus)._M_p;
            local_80.View_._M_len = key->_M_string_length;
            cmStrCat<char[250]>(&err,&local_b8,&local_80,
                                (char (*) [250])
                                "\" is not in the cache. This results in an empty cache entry which is no longer created when policy CMP0102 is set to NEW. Run \"cmake --help-policy CMP0102\" for policy details. Use the cmake_policy command to set the policy and suppress this warning."
                               );
            cmMakefile::IssueMessage(local_c8,AUTHOR_WARNING,&err);
            std::__cxx11::string::~string((string *)&err);
          }
        }
        cVar5 = cmState::GetCacheEntryValue(this,key);
        if (cVar5.Value == (string *)0x0) {
          this_00 = cmMakefile::GetCMakeInstance(local_88->Makefile);
          cmake::AddCacheEntry(this_00,key,(char *)0x0,(char *)0x0,6);
          bVar2 = true;
        }
LAB_002585b3:
        cVar5 = cmState::GetCacheEntryValue(this,key);
        if (cVar5.Value == (string *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,"This should never happen...",(allocator<char> *)&local_80)
          ;
          cmSystemTools::Error((string *)&local_b8);
          goto LAB_00258688;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"ADVANCED",(allocator<char> *)&local_80);
        cVar5 = cmState::GetCacheEntryProperty(this,key,(string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        if (cVar5.Value == (string *)0x0 || bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,"ADVANCED",(allocator<char> *)&err);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,local_c0,&local_c9)
          ;
          cmState::SetCacheEntryProperty(this,key,(string *)&local_b8,(string *)&local_80);
          std::__cxx11::string::~string((string *)&local_80);
          std::__cxx11::string::~string((string *)&local_b8);
        }
        else {
          bVar2 = false;
        }
      }
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool cmMarkAsAdvancedCommand(std::vector<std::string> const& args,
                             cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  unsigned int i = 0;
  const char* value = "1";
  bool overwrite = false;
  if (args[0] == "CLEAR" || args[0] == "FORCE") {
    overwrite = true;
    if (args[0] == "CLEAR") {
      value = "0";
    }
    i = 1;
  }

  cmMakefile& mf = status.GetMakefile();
  cmState* state = mf.GetState();

  for (; i < args.size(); ++i) {
    std::string const& variable = args[i];

    bool issueMessage = false;
    bool oldBehavior = false;
    bool ignoreVariable = false;
    switch (mf.GetPolicyStatus(cmPolicies::CMP0102)) {
      case cmPolicies::WARN:
        if (mf.PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0102")) {
          if (!state->GetCacheEntryValue(variable)) {
            issueMessage = true;
          }
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        oldBehavior = true;
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        if (!state->GetCacheEntryValue(variable)) {
          ignoreVariable = true;
        }
        break;
    }

    // First see if we should issue a message about CMP0102
    if (issueMessage) {
      std::string err = cmStrCat(
        "Policy CMP0102 is not set: The variable named \"", variable,
        "\" is not in the cache. This results in an empty cache entry which "
        "is no longer created when policy CMP0102 is set to NEW. Run \"cmake "
        "--help-policy CMP0102\" for policy details. Use the cmake_policy "
        "command to set the policy and suppress this warning.");
      mf.IssueMessage(MessageType::AUTHOR_WARNING, err);
    }

    // If it's not in the cache and we're using the new behavior, nothing to
    // see here.
    if (ignoreVariable) {
      continue;
    }

    // Check if we want the old behavior of making a dummy cache entry.
    if (oldBehavior) {
      if (!state->GetCacheEntryValue(variable)) {
        status.GetMakefile().GetCMakeInstance()->AddCacheEntry(
          variable, nullptr, nullptr, cmStateEnums::UNINITIALIZED);
        overwrite = true;
      }
    }

    // We need a cache entry to do this.
    if (!state->GetCacheEntryValue(variable)) {
      cmSystemTools::Error("This should never happen...");
      return false;
    }
    if (!state->GetCacheEntryProperty(variable, "ADVANCED") || overwrite) {
      state->SetCacheEntryProperty(variable, "ADVANCED", value);
    }
  }
  return true;
}